

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

bool __thiscall
clipp::parser::try_match_joined_sequence<clipp::detail::select_flags>
          (parser *this,arg_string *arg,select_flags *acceptFirst)

{
  initializer_list<clipp::detail::match_t> __l;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  group *pgVar6;
  pattern *ppVar7;
  ulong uVar8;
  ulong in_RSI;
  subrange sVar9;
  match_t *m;
  iterator __end2;
  iterator __begin2;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *__range2;
  subrange match;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> matches;
  group *parent;
  scoped_dfs_traverser pos;
  match_t fstMatch;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *in_stack_fffffffffffffbf8
  ;
  match_t *in_stack_fffffffffffffc00;
  child_t<clipp::parameter,_clipp::group> *in_stack_fffffffffffffc08;
  match_t *in_stack_fffffffffffffc10;
  arg_string *in_stack_fffffffffffffc18;
  parameter *in_stack_fffffffffffffc20;
  scoped_dfs_traverser *in_stack_fffffffffffffc28;
  scoped_dfs_traverser *in_stack_fffffffffffffc30;
  undefined7 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3f;
  size_type in_stack_fffffffffffffc40;
  undefined1 **local_3b0;
  __normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
  local_370;
  undefined1 *local_368;
  string local_360 [32];
  subrange local_340;
  undefined8 *local_328;
  undefined1 *local_320 [15];
  match_t *in_stack_fffffffffffffd58;
  parser *in_stack_fffffffffffffd60;
  undefined8 *local_260;
  undefined8 local_258;
  undefined1 local_250 [24];
  group *local_238;
  scoped_dfs_traverser local_230;
  undefined4 local_190;
  pointer in_stack_ffffffffffffff78;
  pointer in_stack_ffffffffffffff80;
  scoped_dfs_traverser *in_stack_ffffffffffffff88;
  bool local_1;
  
  detail::scoped_dfs_traverser::scoped_dfs_traverser
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  detail::longest_prefix_match<clipp::detail::select_flags>
            (in_stack_ffffffffffffff88,(arg_string *)in_stack_ffffffffffffff80,
             (select_flags *)in_stack_ffffffffffffff78);
  detail::scoped_dfs_traverser::~scoped_dfs_traverser
            ((scoped_dfs_traverser *)in_stack_fffffffffffffc00);
  bVar1 = detail::match_t::operator_cast_to_bool((match_t *)0x1926f8);
  if (bVar1) {
    detail::match_t::str_abi_cxx11_((match_t *)&stack0xffffffffffffff20);
    lVar4 = std::__cxx11::string::size();
    lVar5 = std::__cxx11::string::size();
    if (lVar4 == lVar5) {
      add_match(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      local_1 = true;
      local_190 = 1;
    }
    else {
      detail::match_t::pos((match_t *)&stack0xffffffffffffff20);
      detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)0x1927c8);
      bVar1 = group::child_t<clipp::parameter,_clipp::group>::blocking(in_stack_fffffffffffffc08);
      if (bVar1) {
        detail::match_t::pos((match_t *)&stack0xffffffffffffff20);
        detail::scoped_dfs_traverser::scoped_dfs_traverser
                  (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        detail::scoped_dfs_traverser::ignore_blocking(&local_230,true);
        local_238 = detail::scoped_dfs_traverser::parent((scoped_dfs_traverser *)0x19282c);
        detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)0x192841);
        bVar1 = group::child_t<clipp::parameter,_clipp::group>::repeatable
                          (in_stack_fffffffffffffc08);
        if (!bVar1) {
          detail::scoped_dfs_traverser::operator++
                    ((scoped_dfs_traverser *)in_stack_fffffffffffffc08);
        }
        detail::match_t::str_abi_cxx11_((match_t *)&stack0xffffffffffffff20);
        std::__cxx11::string::size();
        std::__cxx11::string::erase(in_RSI,0);
        local_328 = local_320;
        detail::match_t::match_t(in_stack_fffffffffffffc10,(match_t *)in_stack_fffffffffffffc08);
        local_260 = local_320;
        local_258 = 1;
        std::allocator<clipp::detail::match_t>::allocator
                  ((allocator<clipp::detail::match_t> *)0x1928ef);
        __l._M_array._7_1_ = in_stack_fffffffffffffc3f;
        __l._M_array._0_7_ = in_stack_fffffffffffffc38;
        __l._M_len = in_stack_fffffffffffffc40;
        std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::vector
                  ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
                   in_stack_fffffffffffffc30,__l,(allocator_type *)in_stack_fffffffffffffc28);
        std::allocator<clipp::detail::match_t>::~allocator
                  ((allocator<clipp::detail::match_t> *)0x192920);
        local_3b0 = (undefined1 **)&local_260;
        do {
          local_3b0 = local_3b0 + -0x18;
          detail::match_t::~match_t(in_stack_fffffffffffffc00);
        } while (local_3b0 != local_320);
LAB_00192964:
        do {
          uVar3 = std::__cxx11::string::empty();
          bVar1 = false;
          if ((uVar3 & 1) == 0) {
            bVar2 = detail::scoped_dfs_traverser::operator_cast_to_bool
                              ((scoped_dfs_traverser *)0x19298f);
            bVar1 = false;
            if (bVar2) {
              detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)0x1929ab);
              bVar2 = group::child_t<clipp::parameter,_clipp::group>::blocking
                                (in_stack_fffffffffffffc08);
              bVar1 = false;
              if (bVar2) {
                ppVar7 = detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)0x1929cf);
                bVar2 = group::child_t<clipp::parameter,_clipp::group>::is_param(ppVar7);
                bVar1 = false;
                if (bVar2) {
                  pgVar6 = detail::scoped_dfs_traverser::parent((scoped_dfs_traverser *)0x1929f3);
                  bVar1 = pgVar6 == local_238;
                }
              }
            }
          }
          if (!bVar1) {
            uVar8 = std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
LAB_00192c91:
              local_1 = false;
            }
            else {
              bVar1 = std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::
                      empty((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
                             *)in_stack_fffffffffffffc10);
              if (bVar1) goto LAB_00192c91;
              local_368 = local_250;
              local_370._M_current =
                   (match_t *)
                   std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::
                   begin(in_stack_fffffffffffffbf8);
              std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::end
                        (in_stack_fffffffffffffbf8);
              while( true ) {
                bVar1 = __gnu_cxx::operator!=
                                  ((__normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
                                    *)in_stack_fffffffffffffc00,
                                   (__normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
                                    *)in_stack_fffffffffffffbf8);
                if (!bVar1) break;
                __gnu_cxx::
                __normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
                ::operator*(&local_370);
                add_match(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
                __gnu_cxx::
                __normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
                ::operator++(&local_370);
              }
              local_1 = true;
            }
            goto LAB_00192d4b;
          }
          ppVar7 = detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)0x192a1c);
          group::child_t<clipp::parameter,_clipp::group>::as_param(ppVar7);
          sVar9 = parameter::match(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          local_340 = sVar9;
          bVar1 = subrange::prefix(&local_340);
          if (!bVar1) goto LAB_00192c24;
          subrange::length(&local_340);
          std::__cxx11::string::substr((ulong)local_360,in_RSI);
          std::vector<clipp::detail::match_t,std::allocator<clipp::detail::match_t>>::
          emplace_back<std::__cxx11::string,clipp::detail::scoped_dfs_traverser&>
                    ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
                     in_stack_fffffffffffffc10,(memento *)in_stack_fffffffffffffc08,
                     (scoped_dfs_traverser *)in_stack_fffffffffffffc00);
          std::__cxx11::string::~string(local_360);
          subrange::length(&local_340);
          std::__cxx11::string::erase(in_RSI,0);
          detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)0x192af7);
          bVar1 = group::child_t<clipp::parameter,_clipp::group>::repeatable
                            (in_stack_fffffffffffffc08);
          if (!bVar1) {
            detail::scoped_dfs_traverser::operator++
                      ((scoped_dfs_traverser *)in_stack_fffffffffffffc08);
          }
        } while( true );
      }
      local_1 = false;
      local_190 = 1;
    }
  }
  else {
    local_1 = false;
    local_190 = 1;
  }
LAB_00192d83:
  detail::match_t::~match_t(in_stack_fffffffffffffc00);
  return local_1;
LAB_00192c24:
  detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)0x192c31);
  bVar1 = group::child_t<clipp::parameter,_clipp::group>::repeatable(in_stack_fffffffffffffc08);
  if (bVar1) goto LAB_00192c55;
  local_1 = false;
LAB_00192d4b:
  local_190 = 1;
  std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::~vector
            ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
             in_stack_fffffffffffffc10);
  detail::scoped_dfs_traverser::~scoped_dfs_traverser
            ((scoped_dfs_traverser *)in_stack_fffffffffffffc00);
  goto LAB_00192d83;
LAB_00192c55:
  detail::scoped_dfs_traverser::operator++((scoped_dfs_traverser *)in_stack_fffffffffffffc08);
  goto LAB_00192964;
}

Assistant:

bool try_match_joined_sequence(arg_string arg,
                                   const ParamSelector& acceptFirst)
    {
        auto fstMatch = detail::longest_prefix_match(pos_, arg, acceptFirst);

        if(!fstMatch) return false;

        if(fstMatch.str().size() == arg.size()) {
            add_match(fstMatch);
            return true;
        }

        if(!fstMatch.pos()->blocking()) return false;

        auto pos = fstMatch.pos();
        pos.ignore_blocking(true);
        const auto parent = &pos.parent();
        if(!pos->repeatable()) ++pos;

        arg.erase(0, fstMatch.str().size());
        std::vector<match_t> matches { std::move(fstMatch) };

        while(!arg.empty() && pos &&
              pos->blocking() && pos->is_param() &&
              (&pos.parent() == parent))
        {
            auto match = pos->as_param().match(arg);

            if(match.prefix()) {
                matches.emplace_back(arg.substr(0,match.length()), pos);
                arg.erase(0, match.length());
                if(!pos->repeatable()) ++pos;
            }
            else {
                if(!pos->repeatable()) return false;
                ++pos;
            }

        }
        //if arg not fully covered => discard temporary matches
        if(!arg.empty() || matches.empty()) return false;

        for(const auto& m : matches) add_match(m);
        return true;
    }